

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O3

int N_VDotProdMulti_Serial(int nvec,N_Vector x,N_Vector *Y,realtype *dotprods)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  realtype rVar6;
  double dVar7;
  
  if (nvec < 1) {
    return -1;
  }
  if (nvec == 1) {
    lVar2 = (long)*x->content;
    if (lVar2 < 1) {
      rVar6 = 0.0;
    }
    else {
      rVar6 = 0.0;
      lVar3 = 0;
      do {
        rVar6 = rVar6 + *(double *)(*(long *)((long)x->content + 8) + lVar3 * 8) *
                        *(double *)(*(long *)((long)(*Y)->content + 8) + lVar3 * 8);
        lVar3 = lVar3 + 1;
      } while (lVar2 != lVar3);
    }
    *dotprods = rVar6;
  }
  else {
    uVar1 = *x->content;
    lVar2 = *(long *)((long)x->content + 8);
    uVar4 = 0;
    do {
      lVar3 = *(long *)((long)Y[uVar4]->content + 8);
      dotprods[uVar4] = 0.0;
      if (0 < (int)uVar1) {
        dVar7 = 0.0;
        uVar5 = 0;
        do {
          dVar7 = dVar7 + *(double *)(lVar2 + uVar5 * 8) * *(double *)(lVar3 + uVar5 * 8);
          dotprods[uVar4] = dVar7;
          uVar5 = uVar5 + 1;
        } while (uVar1 != uVar5);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)nvec);
  }
  return 0;
}

Assistant:

int N_VDotProdMulti_Serial(int nvec, N_Vector x, N_Vector* Y, realtype* dotprods)
{
  int          i;
  sunindextype j, N;
  realtype*    xd=NULL;
  realtype*    yd=NULL;

  /* invalid number of vectors */
  if (nvec < 1) return(-1);

  /* should have called N_VDotProd */
  if (nvec == 1) {
    dotprods[0] = N_VDotProd_Serial(x, Y[0]);
    return(0);
  }

  /* get vector length and data array */
  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);

  /* compute multiple dot products */
  for (i=0; i<nvec; i++) {
    yd = NV_DATA_S(Y[i]);
    dotprods[i] = ZERO;
    for (j=0; j<N; j++) {
      dotprods[i] += xd[j] * yd[j];
    }
  }

  return(0);
}